

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::setInterfaceProperty(FederateState *this,ActionMessage *cmd)

{
  char cVar1;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  bool bVar2;
  action_t aVar3;
  PublicationInfo *pPVar4;
  InterfaceInfo *this_00;
  ActionMessage *in_RSI;
  long in_RDI;
  __sv_type _Var5;
  EndpointInfo *ept;
  PublicationInfo *pub;
  InputInfo *ipt;
  bool used;
  int32_t in_stack_fffffffffffffa10;
  int32_t in_stack_fffffffffffffa14;
  InterfaceInfo *in_stack_fffffffffffffa18;
  InterfaceHandle hid;
  value<fmt::v11::context> *in_stack_fffffffffffffa20;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *this_01;
  InterfaceInfo *in_stack_fffffffffffffa38;
  InterfaceHandle in_stack_fffffffffffffa44;
  InterfaceHandle handle;
  undefined1 local_540 [32];
  __sv_type local_520;
  __sv_type local_510;
  char *local_500;
  undefined8 local_4f8;
  undefined1 local_4f0 [32];
  __sv_type local_4d0;
  __sv_type local_4c0;
  BaseType local_4ac;
  EndpointInfo *local_4a8;
  BaseType local_49c;
  char *local_498;
  undefined8 local_490;
  undefined1 local_488 [32];
  __sv_type local_468;
  undefined1 in_stack_fffffffffffffba8 [16];
  FederateState *in_stack_fffffffffffffbb8;
  char *pcVar6;
  size_t in_stack_fffffffffffffbc0;
  size_t sVar7;
  char *in_stack_fffffffffffffbc8;
  string_view in_stack_fffffffffffffbd0;
  undefined1 local_3d0 [32];
  __sv_type local_3b0;
  __sv_type local_3a0;
  format_args in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc80;
  size_t in_stack_fffffffffffffc88;
  undefined1 local_370 [32];
  __sv_type local_350;
  __sv_type local_340;
  BaseType local_32c;
  InputInfo *local_328;
  BaseType local_320;
  undefined1 local_319;
  ActionMessage *local_318;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_308 [2];
  undefined8 local_2e8;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *local_2e0;
  char *local_2d8;
  undefined8 uStack_2d0;
  string *local_2c0;
  int32_t *local_2b8;
  char *local_2b0;
  undefined8 uStack_2a8;
  undefined1 *local_2a0;
  int32_t local_298 [8];
  undefined8 local_278;
  int32_t *local_270;
  char *local_268;
  undefined8 uStack_260;
  string *local_250;
  int32_t *local_248;
  char *local_240;
  undefined8 uStack_238;
  undefined1 *local_230;
  int32_t local_228 [8];
  undefined8 local_208;
  int32_t *local_200;
  char *local_1f8;
  undefined8 uStack_1f0;
  string *local_1e0;
  int32_t *local_1d8;
  char *local_1d0;
  undefined8 uStack_1c8;
  undefined1 *local_1c0;
  int32_t local_1b8 [4];
  undefined8 local_1a8;
  int32_t *local_1a0;
  char *local_198;
  undefined8 uStack_190;
  int32_t *local_188;
  char *local_180;
  undefined8 uStack_178;
  undefined1 *local_170;
  int32_t local_168 [4];
  undefined8 local_158;
  int32_t *local_150;
  char *local_148;
  undefined8 uStack_140;
  int32_t *local_138;
  char *local_130;
  undefined8 uStack_128;
  undefined1 *local_120;
  int32_t local_118 [4];
  undefined8 local_108;
  int32_t *local_100;
  char *local_f8;
  undefined8 uStack_f0;
  int32_t *local_e0;
  char *local_d8;
  undefined8 uStack_d0;
  undefined1 *local_c8;
  int32_t local_bc;
  int32_t *local_b8;
  int32_t local_ac;
  int32_t *local_a8;
  int32_t local_9c;
  int32_t *local_98;
  int32_t local_8c;
  int32_t *local_88;
  int32_t local_7c;
  int32_t *local_78;
  int32_t local_6c;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *local_68;
  int32_t *local_60;
  undefined8 *local_58;
  int32_t *local_50;
  undefined8 *local_48;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *local_40;
  undefined8 *local_38;
  int32_t *local_30;
  undefined8 *local_28;
  int32_t *local_20;
  undefined8 *local_18;
  int32_t *local_10;
  undefined8 *local_8;
  
  local_318 = in_RSI;
  aVar3 = ActionMessage::action(in_RSI);
  if (aVar3 == cmd_interface_configure) {
    local_319 = 0;
    cVar1 = (char)local_318->counter;
    if (cVar1 == 'e') {
      this_00 = (InterfaceInfo *)(in_RDI + 0x40);
      local_49c = (local_318->dest_handle).hid;
      handle.hid = local_318->messageID;
      bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_318,indicator_flag);
      hid.hid = (BaseType)in_stack_fffffffffffffa20;
      if (bVar2) {
        ActionMessage::getExtraDestData((ActionMessage *)0x4c5d06);
      }
      local_319 = InterfaceInfo::setEndpointProperty
                            (in_stack_fffffffffffffa18,hid,in_stack_fffffffffffffa14,
                             in_stack_fffffffffffffa10);
      if (!(bool)local_319) {
        local_4ac = (local_318->dest_handle).hid;
        local_4a8 = InterfaceInfo::getEndpoint(this_00,handle);
        if (local_4a8 == (EndpointInfo *)0x0) {
          local_510 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          local_188 = &local_318->messageID;
          local_170 = local_540;
          local_180 = "property {} not used on due to unknown endpoint";
          uStack_178 = 0x2f;
          local_198 = "property {} not used on due to unknown endpoint";
          uStack_190 = 0x2f;
          local_9c = *local_188;
          local_98 = local_1b8;
          local_8 = &local_1a8;
          local_1a8 = 1;
          fmt_04.size_ = in_stack_fffffffffffffc88;
          fmt_04.data_ = in_stack_fffffffffffffc80;
          local_10 = local_98;
          local_1b8[0] = local_9c;
          local_1a0 = local_98;
          ::fmt::v11::vformat_abi_cxx11_(fmt_04,in_stack_fffffffffffffc70);
          local_520 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          message_04._M_str = in_stack_fffffffffffffbc8;
          message_04._M_len = in_stack_fffffffffffffbc0;
          logMessage(in_stack_fffffffffffffbb8,in_stack_fffffffffffffba8._12_4_,
                     in_stack_fffffffffffffbd0,message_04,in_stack_fffffffffffffba8[0xb]);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        }
        else {
          local_4c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          local_500 = "property {} not used on endpoint {}";
          local_4f8 = 0x23;
          local_2b8 = &local_318->messageID;
          local_2c0 = &local_4a8->key;
          local_2a0 = local_4f0;
          local_2b0 = "property {} not used on endpoint {}";
          uStack_2a8 = 0x23;
          local_2d8 = "property {} not used on endpoint {}";
          uStack_2d0 = 0x23;
          local_6c = *local_2b8;
          this_01 = local_308;
          local_68 = this_01;
          local_308[0]._0_4_ = local_6c;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)&this_01->string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa18);
          local_38 = &local_2e8;
          local_2e8 = 0xd1;
          fmt_03.size_ = in_stack_fffffffffffffc88;
          fmt_03.data_ = in_stack_fffffffffffffc80;
          local_40 = this_01;
          local_2e0 = this_01;
          ::fmt::v11::vformat_abi_cxx11_(fmt_03,in_stack_fffffffffffffc70);
          local_4d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          message_03._M_str = in_stack_fffffffffffffbc8;
          message_03._M_len = in_stack_fffffffffffffbc0;
          logMessage(in_stack_fffffffffffffbb8,in_stack_fffffffffffffba8._12_4_,
                     in_stack_fffffffffffffbd0,message_03,in_stack_fffffffffffffba8[0xb]);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        }
      }
    }
    else if (cVar1 == 'i') {
      local_320 = (local_318->dest_handle).hid;
      bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_318,indicator_flag);
      if (bVar2) {
        ActionMessage::getExtraDestData((ActionMessage *)0x4c5426);
      }
      local_319 = InterfaceInfo::setInputProperty
                            (in_stack_fffffffffffffa18,
                             (InterfaceHandle)(BaseType)in_stack_fffffffffffffa20,
                             in_stack_fffffffffffffa14,in_stack_fffffffffffffa10);
      if (!(bool)local_319) {
        local_32c = (local_318->dest_handle).hid;
        local_328 = InterfaceInfo::getInput(in_stack_fffffffffffffa38,in_stack_fffffffffffffa44);
        if (local_328 == (InputInfo *)0x0) {
          local_3a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          local_e0 = &local_318->messageID;
          local_c8 = local_3d0;
          local_d8 = "property {} not used on due to unknown input";
          uStack_d0 = 0x2c;
          local_f8 = "property {} not used on due to unknown input";
          uStack_f0 = 0x2c;
          local_bc = *local_e0;
          local_b8 = local_118;
          local_28 = &local_108;
          local_108 = 1;
          fmt_00.size_ = in_stack_fffffffffffffc88;
          fmt_00.data_ = in_stack_fffffffffffffc80;
          local_30 = local_b8;
          local_118[0] = local_bc;
          local_100 = local_b8;
          ::fmt::v11::vformat_abi_cxx11_(fmt_00,in_stack_fffffffffffffc70);
          local_3b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          message_00._M_str = in_stack_fffffffffffffbc8;
          message_00._M_len = in_stack_fffffffffffffbc0;
          logMessage(in_stack_fffffffffffffbb8,in_stack_fffffffffffffba8._12_4_,
                     in_stack_fffffffffffffbd0,message_00,in_stack_fffffffffffffba8[0xb]);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        }
        else {
          local_340 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          pcVar6 = "property {} not used on input {}";
          sVar7 = 0x20;
          local_1d8 = &local_318->messageID;
          local_1e0 = &local_328->key;
          local_1c0 = local_370;
          local_1d0 = "property {} not used on input {}";
          uStack_1c8 = 0x20;
          local_1f8 = "property {} not used on input {}";
          uStack_1f0 = 0x20;
          local_8c = *local_1d8;
          local_88 = local_228;
          local_228[0] = local_8c;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    (in_stack_fffffffffffffa20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa18);
          local_58 = &local_208;
          local_208 = 0xd1;
          fmt.size_ = sVar7;
          fmt.data_ = pcVar6;
          local_60 = local_228;
          local_200 = local_228;
          ::fmt::v11::vformat_abi_cxx11_(fmt,in_stack_fffffffffffffc70);
          local_350 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          message._M_str = in_stack_fffffffffffffbc8;
          message._M_len = in_stack_fffffffffffffbc0;
          logMessage(in_stack_fffffffffffffbb8,in_stack_fffffffffffffba8._12_4_,
                     in_stack_fffffffffffffbd0,message,in_stack_fffffffffffffba8[0xb]);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        }
      }
    }
    else if (cVar1 == 'p') {
      bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_318,indicator_flag);
      if (bVar2) {
        ActionMessage::getExtraDestData((ActionMessage *)0x4c58a2);
      }
      local_319 = InterfaceInfo::setPublicationProperty
                            (in_stack_fffffffffffffa18,
                             (InterfaceHandle)(BaseType)in_stack_fffffffffffffa20,
                             in_stack_fffffffffffffa14,in_stack_fffffffffffffa10);
      if (!(bool)local_319) {
        pPVar4 = InterfaceInfo::getPublication(in_stack_fffffffffffffa38,in_stack_fffffffffffffa44);
        if (pPVar4 == (PublicationInfo *)0x0) {
          _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          local_498 = "property {} not used on due to unknown publication";
          local_490 = 0x32;
          local_138 = &local_318->messageID;
          local_120 = local_488;
          local_130 = "property {} not used on due to unknown publication";
          uStack_128 = 0x32;
          local_148 = "property {} not used on due to unknown publication";
          uStack_140 = 0x32;
          local_ac = *local_138;
          local_a8 = local_168;
          local_18 = &local_158;
          local_158 = 1;
          fmt_02.size_ = in_stack_fffffffffffffc88;
          fmt_02.data_ = in_stack_fffffffffffffc80;
          local_20 = local_a8;
          local_168[0] = local_ac;
          local_150 = local_a8;
          ::fmt::v11::vformat_abi_cxx11_(fmt_02,in_stack_fffffffffffffc70);
          local_468 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          message_02._M_str = in_stack_fffffffffffffbc8;
          message_02._M_len = in_stack_fffffffffffffbc0;
          logMessage(in_stack_fffffffffffffbb8,_Var5._M_str._4_4_,in_stack_fffffffffffffbd0,
                     message_02,_Var5._M_str._3_1_);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        }
        else {
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          pcVar6 = "property {} not used on publication {}";
          sVar7 = 0x26;
          local_248 = &local_318->messageID;
          local_250 = &pPVar4->key;
          local_230 = &stack0xfffffffffffffbc8;
          local_240 = "property {} not used on publication {}";
          uStack_238 = 0x26;
          local_268 = "property {} not used on publication {}";
          uStack_260 = 0x26;
          local_7c = *local_248;
          local_78 = local_298;
          local_298[0] = local_7c;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    (in_stack_fffffffffffffa20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa18);
          local_48 = &local_278;
          local_278 = 0xd1;
          fmt_01.size_ = in_stack_fffffffffffffc88;
          fmt_01.data_ = in_stack_fffffffffffffc80;
          local_50 = local_298;
          local_270 = local_298;
          ::fmt::v11::vformat_abi_cxx11_(fmt_01,in_stack_fffffffffffffc70);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          message_01._M_str = in_stack_fffffffffffffbc8;
          message_01._M_len = sVar7;
          logMessage((FederateState *)pcVar6,in_stack_fffffffffffffba8._12_4_,
                     in_stack_fffffffffffffbd0,message_01,in_stack_fffffffffffffba8[0xb]);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        }
      }
    }
  }
  return;
}

Assistant:

void FederateState::setInterfaceProperty(const ActionMessage& cmd)
{
    if (cmd.action() != CMD_INTERFACE_CONFIGURE) {
        return;
    }
    bool used = false;
    switch (static_cast<char>(cmd.counter)) {
        case 'i':
            used = interfaceInformation.setInputProperty(cmd.dest_handle,
                                                         cmd.messageID,
                                                         checkActionFlag(cmd, indicator_flag) ?
                                                             cmd.getExtraDestData() :
                                                             0);
            if (!used) {
                auto* ipt = interfaceInformation.getInput(cmd.dest_handle);
                if (ipt != nullptr) {
                    LOG_WARNING(
                        fmt::format("property {} not used on input {}", cmd.messageID, ipt->key));
                } else {
                    LOG_WARNING(
                        fmt::format("property {} not used on due to unknown input", cmd.messageID));
                }
            }
            break;
        case 'p':
            used =
                interfaceInformation.setPublicationProperty(cmd.dest_handle,
                                                            cmd.messageID,
                                                            checkActionFlag(cmd, indicator_flag) ?
                                                                cmd.getExtraDestData() :
                                                                0);
            if (!used) {
                auto* pub = interfaceInformation.getPublication(cmd.dest_handle);
                if (pub != nullptr) {
                    LOG_WARNING(fmt::format("property {} not used on publication {}",
                                            cmd.messageID,
                                            pub->key));
                } else {
                    LOG_WARNING(fmt::format("property {} not used on due to unknown publication",
                                            cmd.messageID));
                }
            }
            break;
        case 'e':
            used = interfaceInformation.setEndpointProperty(cmd.dest_handle,
                                                            cmd.messageID,
                                                            checkActionFlag(cmd, indicator_flag) ?
                                                                cmd.getExtraDestData() :
                                                                0);
            if (!used) {
                auto* ept = interfaceInformation.getEndpoint(cmd.dest_handle);
                if (ept != nullptr) {
                    LOG_WARNING(fmt::format("property {} not used on endpoint {}",
                                            cmd.messageID,
                                            ept->key));
                } else {
                    LOG_WARNING(fmt::format("property {} not used on due to unknown endpoint",
                                            cmd.messageID));
                }
            }
            break;
        default:
            break;
    }
}